

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

void heapify32b(float32 *a,uint32 *k,uint32 i,uint32 sz,hcmpfn32b_t cmp)

{
  uint uVar1;
  float32 fVar2;
  uint32 uVar3;
  int iVar4;
  uint uVar5;
  
  while( true ) {
    uVar5 = i * 2 + 1;
    if ((sz <= uVar5) || (iVar4 = (*cmp)(a[uVar5],a[i]), iVar4 == 0)) {
      uVar5 = i;
    }
    uVar1 = i * 2 + 2;
    if ((uVar1 < sz) && (iVar4 = (*cmp)(a[uVar1],a[uVar5]), iVar4 != 0)) {
      uVar5 = uVar1;
    }
    if (uVar5 == i) break;
    fVar2 = a[i];
    a[i] = a[uVar5];
    a[uVar5] = fVar2;
    uVar3 = k[i];
    k[i] = k[uVar5];
    k[uVar5] = uVar3;
    i = uVar5;
  }
  return;
}

Assistant:

void
heapify32b(float32 *a, uint32 *k,
	    uint32 i,
	    uint32 sz,
	    hcmpfn32b_t cmp)
{
    uint32 l, r, b, t_k;
    float32 t_a;

    l = LEFT(i);
    r = RIGHT(i);

    /* Determine the "best" node of i, l or r */
    if ((l < sz) && cmp(a[l], a[i]))
	b = l;
    else
	b = i;

    if ((r < sz) && cmp(a[r], a[b]))
	b = r;

    /* If node i is not the first in the ordering,
     * then switch i with the left or right child that is first and
     * heapify the the tree rooted at the new node i position
     */
    if (b != i) {
	/* exchange the values... */
	t_a = a[i];
	a[i] = a[b];
	a[b] = t_a;

	/* ... and the keys */
	t_k = k[i];
	k[i] = k[b];
	k[b] = t_k;

	heapify32b(a, k, b, sz, cmp);
    }
}